

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructorCache.cpp
# Opt level: O2

void __thiscall Js::ConstructorCache::UpdateInlineSlotCount(ConstructorCache *this)

{
  DynamicTypeHandler *pDVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  undefined4 *puVar6;
  DynamicType *pDVar7;
  
  bVar3 = IsConsistent(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x71,"(IsConsistent())","IsConsistent()");
    if (!bVar3) goto LAB_00883f19;
    *puVar6 = 0;
  }
  bVar4 = (this->content).field_0x14;
  if ((bVar4 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x72,"(this->content.isPopulated)","this->content.isPopulated");
    if (!bVar3) goto LAB_00883f19;
    *puVar6 = 0;
    bVar4 = (this->content).field_0x14;
  }
  pDVar7 = (DynamicType *)(this->super_PropertyGuard).value;
  if (pDVar7 < (DynamicType *)0x2) {
    if ((pDVar7 == (DynamicType *)&DAT_00000001 & (bVar4 & 4) >> 2) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                  ,0x73,"(IsEnabled() || NeedsTypeUpdate())",
                                  "IsEnabled() || NeedsTypeUpdate()");
      if (!bVar3) goto LAB_00883f19;
      *puVar6 = 0;
      bVar4 = (this->content).field_0x14;
      pDVar7 = (DynamicType *)(this->super_PropertyGuard).value;
    }
    else {
      pDVar7 = (DynamicType *)&DAT_00000001;
    }
  }
  if ((bVar4 & 4) != 0) {
    pDVar7 = (this->content).pendingType.ptr;
  }
  pDVar1 = (pDVar7->typeHandler).ptr;
  if ((int)(this->content).inlineSlotCount < (int)(uint)pDVar1->inlineSlotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x7f,
                                "(typeHandler->GetInlineSlotCapacity() <= this->content.inlineSlotCount)"
                                ,
                                "typeHandler->GetInlineSlotCapacity() <= this->content.inlineSlotCount"
                               );
    if (!bVar3) goto LAB_00883f19;
    *puVar6 = 0;
  }
  iVar5 = pDVar1->slotCapacity;
  if ((this->content).slotCount < iVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x81,"(typeHandler->GetSlotCapacity() <= this->content.slotCount)",
                                "typeHandler->GetSlotCapacity() <= this->content.slotCount");
    if (!bVar3) goto LAB_00883f19;
    *puVar6 = 0;
    iVar5 = pDVar1->slotCapacity;
  }
  (this->content).slotCount = iVar5;
  (this->content).inlineSlotCount = pDVar1->inlineSlotCapacity;
  bVar3 = IsConsistent(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x84,"(IsConsistent())","IsConsistent()");
    if (!bVar3) {
LAB_00883f19:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  return;
}

Assistant:

void ConstructorCache::UpdateInlineSlotCount()
    {
        Assert(IsConsistent());
        Assert(this->content.isPopulated);
        Assert(IsEnabled() || NeedsTypeUpdate());
        DynamicType* type;
        if (this->content.typeUpdatePending)
        {
            type = this->content.pendingType;
        }
        else
        {
            type = reinterpret_cast<DynamicType*>(this->GetValue());
        }
        DynamicTypeHandler* typeHandler = type->GetTypeHandler();
        // Inline slot capacity should never grow as a result of shrinking.
        Assert(typeHandler->GetInlineSlotCapacity() <= this->content.inlineSlotCount);
        // Slot capacity should never grow as a result of shrinking.
        Assert(typeHandler->GetSlotCapacity() <= this->content.slotCount);
        this->content.slotCount = typeHandler->GetSlotCapacity();
        this->content.inlineSlotCount = typeHandler->GetInlineSlotCapacity();
        Assert(IsConsistent());
    }